

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::validate_module_capability(Impl *this,Capability cap)

{
  size_type sVar1;
  bool local_400;
  bool local_3ff;
  bool local_3fe;
  bool local_3fd;
  bool local_3fc;
  bool local_3fb;
  bool local_3fa;
  bool local_3f9;
  bool local_3f8;
  bool local_3f7;
  bool local_3f6;
  bool local_3f5;
  bool local_3f4;
  bool local_3f3;
  bool local_3f2;
  bool local_3f1;
  bool local_3f0;
  bool local_3ef;
  bool local_3ee;
  bool local_3ed;
  bool local_3ec;
  bool local_3eb;
  bool local_3ea;
  bool local_3e9;
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [37];
  byte local_33b;
  byte local_33a;
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [37];
  byte local_273;
  byte local_272;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [37];
  byte local_223;
  byte local_222;
  allocator local_221;
  string local_220 [37];
  byte local_1fb;
  byte local_1fa;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [37];
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [37];
  byte local_6b;
  byte local_6a;
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [36];
  Capability local_1c;
  Impl *pIStack_18;
  Capability cap_local;
  Impl *this_local;
  
  if (CapabilityShader < cap) {
    if (cap == CapabilityGeometry) {
      this_local._7_1_ = (this->features2).features.geometryShader == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityTessellation) {
      this_local._7_1_ = (this->features2).features.tessellationShader == 1;
      goto LAB_00117e0c;
    }
    local_1c = cap;
    pIStack_18 = this;
    if (cap == CapabilityFloat16) {
      local_33a = 0;
      local_33b = 0;
      local_3f7 = true;
      if ((this->features).float16_int8.shaderFloat16 != 1) {
        std::allocator<char>::allocator();
        local_33a = 1;
        std::__cxx11::string::string(local_338,"VK_AMD_gpu_shader_half_float",&local_339);
        local_33b = 1;
        sVar1 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_338);
        local_3f7 = sVar1 != 0;
      }
      this_local._7_1_ = local_3f7;
      if ((local_33b & 1) != 0) {
        std::__cxx11::string::~string(local_338);
      }
      if ((local_33a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_339);
      }
      goto LAB_00117e0c;
    }
    if (cap == CapabilityFloat64) {
      this_local._7_1_ = (this->features2).features.shaderFloat64 == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityInt64) {
      this_local._7_1_ = (this->features2).features.shaderInt64 == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityInt64Atomics) {
      local_3e9 = true;
      if (((this->features).atomic_int64.shaderBufferInt64Atomics != 1) &&
         (local_3e9 = true, (this->features).atomic_int64.shaderSharedInt64Atomics != 1)) {
        local_3e9 = (this->features).shader_image_atomic_int64.shaderImageInt64Atomics == 1;
      }
      this_local._7_1_ = local_3e9;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityGroups) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"VK_AMD_shader_ballot",&local_41);
      sVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_40);
      this_local._7_1_ = sVar1 != 0;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      goto LAB_00117e0c;
    }
    if (cap == CapabilityInt16) {
      this_local._7_1_ = (this->features2).features.shaderInt16 == 1;
      goto LAB_00117e0c;
    }
    if (cap - CapabilityTessellationPointSize < 2) {
      this_local._7_1_ = (this->features2).features.shaderTessellationAndGeometryPointSize == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityImageGatherExtended) {
      this_local._7_1_ = (this->features2).features.shaderImageGatherExtended == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityStorageImageMultisample) {
      this_local._7_1_ = (this->features2).features.shaderStorageImageMultisample == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityUniformBufferArrayDynamicIndexing) {
      this_local._7_1_ = (this->features2).features.shaderUniformBufferArrayDynamicIndexing == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilitySampledImageArrayDynamicIndexing) {
      this_local._7_1_ = (this->features2).features.shaderSampledImageArrayDynamicIndexing == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityStorageBufferArrayDynamicIndexing) {
      this_local._7_1_ = (this->features2).features.shaderStorageBufferArrayDynamicIndexing == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityStorageImageArrayDynamicIndexing) {
      this_local._7_1_ = (this->features2).features.shaderStorageImageArrayDynamicIndexing == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityClipDistance) {
      this_local._7_1_ = (this->features2).features.shaderClipDistance == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityCullDistance) {
      this_local._7_1_ = (this->features2).features.shaderCullDistance == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityImageCubeArray) {
      this_local._7_1_ = (this->features2).features.imageCubeArray == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilitySampleRateShading) {
      this_local._7_1_ = (this->features2).features.sampleRateShading == 1;
      goto LAB_00117e0c;
    }
    if (cap == CapabilityInt8) {
      this_local._7_1_ = (this->features).float16_int8.shaderInt8 == 1;
      goto LAB_00117e0c;
    }
    if (cap != CapabilityInputAttachment) {
      if (cap == CapabilitySparseResidency) {
        this_local._7_1_ = (this->features2).features.shaderResourceResidency == 1;
        goto LAB_00117e0c;
      }
      if (cap == CapabilityMinLod) {
        this_local._7_1_ = (this->features2).features.shaderResourceMinLod == 1;
        goto LAB_00117e0c;
      }
      if (1 < cap - CapabilitySampled1D) {
        if (cap == CapabilitySampledCubeArray) {
          this_local._7_1_ = (this->features2).features.imageCubeArray == 1;
          goto LAB_00117e0c;
        }
        if (1 < cap - CapabilitySampledBuffer) {
          if (cap == CapabilityImageMSArray) {
            this_local._7_1_ = (this->features2).features.shaderStorageImageMultisample == 1;
            goto LAB_00117e0c;
          }
          if (2 < cap - CapabilityStorageImageExtendedFormats) {
            if (cap == CapabilityInterpolationFunction) {
              this_local._7_1_ = (this->features2).features.sampleRateShading == 1;
            }
            else if (cap == CapabilityTransformFeedback) {
              this_local._7_1_ = (this->features).transform_feedback.transformFeedback == 1;
            }
            else if (cap == CapabilityGeometryStreams) {
              this_local._7_1_ = (this->features).transform_feedback.geometryStreams == 1;
            }
            else if (cap == CapabilityStorageImageReadWithoutFormat) {
              local_6a = 0;
              local_6b = 0;
              local_3f0 = true;
              if (((this->features2).features.shaderStorageImageReadWithoutFormat != 1) &&
                 (local_3f0 = true, this->api_version < 0x403000)) {
                std::allocator<char>::allocator();
                local_6a = 1;
                std::__cxx11::string::string(local_68,"VK_KHR_format_feature_flags2",&local_69);
                local_6b = 1;
                sVar1 = std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&this->enabled_extensions,(key_type *)local_68);
                local_3f0 = sVar1 != 0;
              }
              this_local._7_1_ = local_3f0;
              if ((local_6b & 1) != 0) {
                std::__cxx11::string::~string(local_68);
              }
              if ((local_6a & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_69);
              }
            }
            else if (cap == CapabilityStorageImageWriteWithoutFormat) {
              local_92 = 0;
              local_93 = 0;
              local_3f1 = true;
              if (((this->features2).features.shaderStorageImageWriteWithoutFormat != 1) &&
                 (local_3f1 = true, this->api_version < 0x403000)) {
                std::allocator<char>::allocator();
                local_92 = 1;
                std::__cxx11::string::string(local_90,"VK_KHR_format_feature_flags2",&local_91);
                local_93 = 1;
                sVar1 = std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&this->enabled_extensions,(key_type *)local_90);
                local_3f1 = sVar1 != 0;
              }
              this_local._7_1_ = local_3f1;
              if ((local_93 & 1) != 0) {
                std::__cxx11::string::~string(local_90);
              }
              if ((local_92 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_91);
              }
            }
            else if (cap == CapabilityMultiViewport) {
              this_local._7_1_ = (this->features2).features.multiViewport == 1;
            }
            else if (cap == CapabilityGroupNonUniform) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 1) != 0;
            }
            else if (cap == CapabilityGroupNonUniformVote) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 2) != 0;
            }
            else if (cap == CapabilityGroupNonUniformArithmetic) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 4) != 0;
            }
            else if (cap == CapabilityGroupNonUniformBallot) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 8) != 0;
            }
            else if (cap == CapabilityGroupNonUniformShuffle) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 0x10) != 0;
            }
            else if (cap == CapabilityGroupNonUniformShuffleRelative) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 0x20) != 0;
            }
            else if (cap == CapabilityGroupNonUniformClustered) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 0x40) != 0;
            }
            else if (cap == CapabilityGroupNonUniformQuad) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 0x80) != 0;
            }
            else if (cap == CapabilityShaderLayer) {
              local_222 = 0;
              local_223 = 0;
              local_3f4 = true;
              if ((this->features).vk12.shaderOutputLayer == 0) {
                std::allocator<char>::allocator();
                local_222 = 1;
                std::__cxx11::string::string
                          (local_220,"VK_EXT_shader_viewport_index_layer",&local_221);
                local_223 = 1;
                sVar1 = std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&this->enabled_extensions,(key_type *)local_220);
                local_3f4 = sVar1 != 0;
              }
              this_local._7_1_ = local_3f4;
              if ((local_223 & 1) != 0) {
                std::__cxx11::string::~string(local_220);
              }
              if ((local_222 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_221);
              }
            }
            else if (cap == CapabilityShaderViewportIndex) {
              local_1fa = 0;
              local_1fb = 0;
              local_3f3 = true;
              if ((this->features).vk12.shaderOutputViewportIndex == 0) {
                std::allocator<char>::allocator();
                local_1fa = 1;
                std::__cxx11::string::string
                          (local_1f8,"VK_EXT_shader_viewport_index_layer",&local_1f9);
                local_1fb = 1;
                sVar1 = std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&this->enabled_extensions,(key_type *)local_1f8);
                local_3f3 = sVar1 != 0;
              }
              this_local._7_1_ = local_3f3;
              if ((local_1fb & 1) != 0) {
                std::__cxx11::string::~string(local_1f8);
              }
              if ((local_1fa & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
              }
            }
            else if (cap == CapabilityCoreBuiltinsARM) {
              this_local._7_1_ = (this->features).shader_core_builtins_arm.shaderCoreBuiltins == 1;
            }
            else if (cap == CapabilityTileImageColorReadAccessEXT) {
              this_local._7_1_ =
                   (this->features).shader_tile_image.shaderTileImageColorReadAccess == 1;
            }
            else if (cap == CapabilityTileImageDepthReadAccessEXT) {
              this_local._7_1_ =
                   (this->features).shader_tile_image.shaderTileImageDepthReadAccess == 1;
            }
            else if (cap == CapabilityTileImageStencilReadAccessEXT) {
              this_local._7_1_ =
                   (this->features).shader_tile_image.shaderTileImageStencilReadAccess == 1;
            }
            else if (cap == CapabilityFragmentShadingRateKHR) {
              this_local._7_1_ =
                   (this->features).fragment_shading_rate.primitiveFragmentShadingRate == 1;
            }
            else if (cap == CapabilitySubgroupBallotKHR) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_e0,"VK_EXT_shader_subgroup_ballot",&local_e1);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_e0);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_e1);
            }
            else if (cap == CapabilityDrawParameters) {
              this_local._7_1_ = (this->features).draw_parameters.shaderDrawParameters == 1;
            }
            else if (cap == CapabilityWorkgroupMemoryExplicitLayoutKHR) {
              this_local._7_1_ =
                   (this->features).workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout
                   == 1;
            }
            else if (cap == CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR) {
              this_local._7_1_ =
                   (this->features).workgroup_memory_explicit_layout.
                   workgroupMemoryExplicitLayout8BitAccess == 1;
            }
            else if (cap == CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR) {
              this_local._7_1_ =
                   (this->features).workgroup_memory_explicit_layout.
                   workgroupMemoryExplicitLayout16BitAccess == 1;
            }
            else if (cap == CapabilitySubgroupVoteKHR) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_108,"VK_EXT_shader_subgroup_vote",&local_109);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_108);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_108);
              std::allocator<char>::~allocator((allocator<char> *)&local_109);
            }
            else if (cap == CapabilityStorageBuffer16BitAccess) {
              this_local._7_1_ = (this->features).storage_16bit.storageBuffer16BitAccess == 1;
            }
            else if (cap == CapabilityStorageUniform16) {
              this_local._7_1_ =
                   (this->features).storage_16bit.uniformAndStorageBuffer16BitAccess == 1;
            }
            else if (cap == CapabilityStoragePushConstant16) {
              this_local._7_1_ = (this->features).storage_16bit.storagePushConstant16 == 1;
            }
            else if (cap == CapabilityStorageInputOutput16) {
              this_local._7_1_ = (this->features).storage_16bit.storageInputOutput16 == 1;
            }
            else if (cap == CapabilityDeviceGroup) {
              this_local._7_1_ = 0x400fff < this->api_version;
            }
            else if (cap == CapabilityMultiView) {
              this_local._7_1_ = (this->features).multiview.multiview == 1;
            }
            else if (cap == CapabilityVariablePointersStorageBuffer) {
              this_local._7_1_ =
                   (this->features).variable_pointers.variablePointersStorageBuffer == 1;
            }
            else if (cap == CapabilityVariablePointers) {
              this_local._7_1_ = (this->features).variable_pointers.variablePointers == 1;
            }
            else if (cap == CapabilitySampleMaskPostDepthCoverage) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2e8,"VK_EXT_post_depth_coverage",&local_2e9);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_2e8);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_2e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
            }
            else if (cap == CapabilityStorageBuffer8BitAccess) {
              this_local._7_1_ = (this->features).storage_8bit.storageBuffer8BitAccess == 1;
            }
            else if (cap == CapabilityUniformAndStorageBuffer8BitAccess) {
              this_local._7_1_ =
                   (this->features).storage_8bit.uniformAndStorageBuffer8BitAccess == 1;
            }
            else if (cap == CapabilityStoragePushConstant8) {
              this_local._7_1_ = (this->features).storage_8bit.storagePushConstant8 == 1;
            }
            else if (cap == CapabilityDenormPreserve) {
              local_3f8 = true;
              if (((this->props).float_control.shaderDenormPreserveFloat16 != 1) &&
                 (local_3f8 = true, (this->props).float_control.shaderDenormPreserveFloat32 != 1)) {
                local_3f8 = (this->props).float_control.shaderDenormPreserveFloat64 == 1;
              }
              this_local._7_1_ = local_3f8;
            }
            else if (cap == CapabilityDenormFlushToZero) {
              local_3f9 = true;
              if (((this->props).float_control.shaderDenormFlushToZeroFloat16 != 1) &&
                 (local_3f9 = true, (this->props).float_control.shaderDenormFlushToZeroFloat32 != 1)
                 ) {
                local_3f9 = (this->props).float_control.shaderDenormFlushToZeroFloat64 == 1;
              }
              this_local._7_1_ = local_3f9;
            }
            else if (cap == CapabilitySignedZeroInfNanPreserve) {
              local_3fa = true;
              if (((this->props).float_control.shaderSignedZeroInfNanPreserveFloat16 != 1) &&
                 (local_3fa = true,
                 (this->props).float_control.shaderSignedZeroInfNanPreserveFloat32 != 1)) {
                local_3fa = (this->props).float_control.shaderSignedZeroInfNanPreserveFloat64 == 1;
              }
              this_local._7_1_ = local_3fa;
            }
            else if (cap == CapabilityRoundingModeRTE) {
              local_3fb = true;
              if (((this->props).float_control.shaderRoundingModeRTEFloat16 != 1) &&
                 (local_3fb = true, (this->props).float_control.shaderRoundingModeRTEFloat32 != 1))
              {
                local_3fb = (this->props).float_control.shaderRoundingModeRTEFloat64 == 1;
              }
              this_local._7_1_ = local_3fb;
            }
            else if (cap == CapabilityRoundingModeRTZ) {
              local_3fc = true;
              if (((this->props).float_control.shaderRoundingModeRTZFloat16 != 1) &&
                 (local_3fc = true, (this->props).float_control.shaderRoundingModeRTZFloat32 != 1))
              {
                local_3fc = (this->props).float_control.shaderRoundingModeRTZFloat64 == 1;
              }
              this_local._7_1_ = local_3fc;
            }
            else if (cap == CapabilityRayQueryKHR) {
              this_local._7_1_ = (this->features).ray_query.rayQuery == 1;
            }
            else if (cap == CapabilityRayTraversalPrimitiveCullingKHR) {
              local_400 = true;
              if ((this->features).ray_tracing_pipeline.rayTraversalPrimitiveCulling != 1) {
                local_400 = (this->features).ray_query.rayQuery == 1;
              }
              this_local._7_1_ = local_400;
            }
            else if (cap == CapabilityRayTracingKHR) {
              this_local._7_1_ = (this->features).ray_tracing_pipeline.rayTracingPipeline == 1;
            }
            else if (cap == CapabilityTextureSampleWeightedQCOM) {
              this_local._7_1_ = (this->features).image_processing_qcom.textureSampleWeighted == 1;
            }
            else if (cap == CapabilityTextureBoxFilterQCOM) {
              this_local._7_1_ = (this->features).image_processing_qcom.textureBoxFilter == 1;
            }
            else if (cap == CapabilityTextureBlockMatchQCOM) {
              this_local._7_1_ = (this->features).image_processing_qcom.textureBlockMatch == 1;
            }
            else if (cap == CapabilityTextureBlockMatch2QCOM) {
              this_local._7_1_ = (this->features).image_processing2_qcom.textureBlockMatch2 == 1;
            }
            else if (cap == CapabilityImageGatherBiasLodAMD) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_158,"VK_AMD_texture_gather_bias_lod",&local_159);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_158);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_158);
              std::allocator<char>::~allocator((allocator<char> *)&local_159);
            }
            else if (cap == CapabilityFragmentMaskAMD) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_180,"VK_AMD_shader_fragment_mask",&local_181);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_180);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_180);
              std::allocator<char>::~allocator((allocator<char> *)&local_181);
            }
            else if (cap == CapabilityStencilExportEXT) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_b8,"VK_EXT_shader_stencil_export",&local_b9);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_b8);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_b9);
            }
            else if (cap == CapabilityImageReadWriteLodAMD) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_130,"VK_AMD_shader_image_load_store_lod",&local_131);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_130);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_130);
              std::allocator<char>::~allocator((allocator<char> *)&local_131);
            }
            else if (cap == CapabilityInt64ImageEXT) {
              this_local._7_1_ =
                   (this->features).shader_image_atomic_int64.shaderImageInt64Atomics == 1;
            }
            else if (cap == CapabilityShaderClockKHR) {
              local_3f2 = false;
              if ((this->features).shader_clock.shaderDeviceClock == 1) {
                local_3f2 = (this->features).shader_clock.shaderSubgroupClock == 1;
              }
              this_local._7_1_ = local_3f2;
            }
            else if (cap == CapabilityQuadControlKHR) {
              this_local._7_1_ = (this->features).shader_quad_control.shaderQuadControl == 1;
            }
            else if (cap == CapabilitySampleMaskOverrideCoverageNV) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_1a8,"VK_NV_sample_mask_override_coverage",&local_1a9);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_1a8);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_1a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
            }
            else if (cap == CapabilityGeometryShaderPassthroughNV) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1d0,"VK_NV_geometry_shader_passthrough",&local_1d1)
              ;
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_1d0);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_1d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            }
            else if (cap == CapabilityShaderViewportIndexLayerEXT) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_248,"VK_EXT_shader_viewport_index_layer",&local_249);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_248);
              local_272 = 0;
              local_273 = 0;
              local_3f5 = true;
              if (sVar1 == 0) {
                std::allocator<char>::allocator();
                local_272 = 1;
                std::__cxx11::string::string(local_270,"VK_NV_viewport_array2",&local_271);
                local_273 = 1;
                sVar1 = std::
                        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&this->enabled_extensions,(key_type *)local_270);
                local_3f5 = sVar1 != 0;
              }
              this_local._7_1_ = local_3f5;
              if ((local_273 & 1) != 0) {
                std::__cxx11::string::~string(local_270);
              }
              if ((local_272 & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)&local_271);
              }
              std::__cxx11::string::~string(local_248);
              std::allocator<char>::~allocator((allocator<char> *)&local_249);
            }
            else if (cap == CapabilityShaderViewportMaskNV) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_298,"VK_NV_viewport_array2",&local_299);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_298);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_298);
              std::allocator<char>::~allocator((allocator<char> *)&local_299);
            }
            else if (cap == CapabilityPerViewAttributesNV) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_2c0,"VK_NVX_multiview_per_view_attributes",&local_2c1);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_2c0);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_2c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
            }
            else if (cap == CapabilityFragmentFullyCoveredEXT) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_388,"VK_EXT_conservative_rasterization",&local_389)
              ;
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_388);
              this_local._7_1_ = sVar1 != 0;
              std::__cxx11::string::~string(local_388);
              std::allocator<char>::~allocator((allocator<char> *)&local_389);
            }
            else if (cap == CapabilityMeshShadingNV) {
              this_local._7_1_ = (this->features).mesh_shader_nv.meshShader == 1;
            }
            else if (cap == CapabilityImageFootprintNV) {
              this_local._7_1_ = (this->features).image_footprint_nv.imageFootprint == 1;
            }
            else if (cap == CapabilityMeshShadingEXT) {
              this_local._7_1_ = (this->features).mesh_shader.meshShader == 1;
            }
            else if (cap == CapabilityFragmentBarycentricKHR) {
              this_local._7_1_ = (this->features).barycentric.fragmentShaderBarycentric == 1;
            }
            else if (cap == CapabilityComputeDerivativeGroupQuadsKHR) {
              this_local._7_1_ =
                   (this->features).compute_shader_derivatives.computeDerivativeGroupQuads == 1;
            }
            else if (cap == CapabilityFragmentDensityEXT) {
              local_3fd = true;
              if ((this->features).shading_rate_nv.shadingRateImage != 1) {
                local_3fd = (this->features).fragment_density.fragmentDensityMap == 1;
              }
              this_local._7_1_ = local_3fd;
            }
            else if (cap == CapabilityGroupNonUniformPartitionedNV) {
              this_local._7_1_ = ((this->props).subgroup.supportedOperations & 0x100) != 0;
            }
            else if (cap == CapabilityShaderNonUniform) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_310,"VK_EXT_descriptor_indexing",&local_311);
              sVar1 = std::
                      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(&this->enabled_extensions,(key_type *)local_310);
              local_3f6 = true;
              if (sVar1 == 0) {
                local_3f6 = 0x401fff < this->api_version;
              }
              this_local._7_1_ = local_3f6;
              std::__cxx11::string::~string(local_310);
              std::allocator<char>::~allocator((allocator<char> *)&local_311);
            }
            else if (cap == CapabilityRuntimeDescriptorArray) {
              this_local._7_1_ = (this->features).descriptor_indexing.runtimeDescriptorArray == 1;
            }
            else if (cap == CapabilityInputAttachmentArrayDynamicIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderInputAttachmentArrayDynamicIndexing ==
                   1;
            }
            else if (cap == CapabilityUniformTexelBufferArrayDynamicIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderUniformTexelBufferArrayDynamicIndexing
                   == 1;
            }
            else if (cap == CapabilityStorageTexelBufferArrayDynamicIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderStorageTexelBufferArrayDynamicIndexing
                   == 1;
            }
            else if (cap == CapabilityUniformBufferArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderUniformBufferArrayNonUniformIndexing
                   == 1;
            }
            else if (cap == CapabilitySampledImageArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderSampledImageArrayNonUniformIndexing ==
                   1;
            }
            else if (cap == CapabilityStorageBufferArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderStorageBufferArrayNonUniformIndexing
                   == 1;
            }
            else if (cap == CapabilityStorageImageArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderStorageImageArrayNonUniformIndexing ==
                   1;
            }
            else if (cap == CapabilityInputAttachmentArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexing
                   == 1;
            }
            else if (cap == CapabilityUniformTexelBufferArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.
                   shaderUniformTexelBufferArrayNonUniformIndexing == 1;
            }
            else if (cap == CapabilityStorageTexelBufferArrayNonUniformIndexing) {
              this_local._7_1_ =
                   (this->features).descriptor_indexing.
                   shaderStorageTexelBufferArrayNonUniformIndexing == 1;
            }
            else {
              if (cap != CapabilityRayTracingPositionFetchKHR) {
                if (cap == CapabilityRayTracingNV) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_360,"VK_NV_ray_tracing",&local_361);
                  sVar1 = std::
                          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::count(&this->enabled_extensions,(key_type *)local_360);
                  this_local._7_1_ = sVar1 != 0;
                  std::__cxx11::string::~string(local_360);
                  std::allocator<char>::~allocator((allocator<char> *)&local_361);
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityRayTracingMotionBlurNV) {
                  this_local._7_1_ =
                       (this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityVulkanMemoryModel) {
                  this_local._7_1_ = (this->features).memory_model.vulkanMemoryModel == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityVulkanMemoryModelDeviceScope) {
                  this_local._7_1_ = (this->features).memory_model.vulkanMemoryModelDeviceScope == 1
                  ;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityPhysicalStorageBufferAddresses) {
                  local_3fe = true;
                  if ((this->features).buffer_device_address.bufferDeviceAddress != 1) {
                    local_3fe = (this->features).buffer_device_address_ext.bufferDeviceAddress == 1;
                  }
                  this_local._7_1_ = local_3fe;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityComputeDerivativeGroupLinearKHR) {
                  this_local._7_1_ =
                       (this->features).compute_shader_derivatives.computeDerivativeGroupLinear == 1
                  ;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityCooperativeMatrixNV) {
                  this_local._7_1_ = (this->features).cooperative_matrix_nv.cooperativeMatrix == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityFragmentShaderSampleInterlockEXT) {
                  this_local._7_1_ =
                       (this->features).shader_interlock.fragmentShaderSampleInterlock == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityFragmentShaderShadingRateInterlockEXT) {
                  local_3ff = true;
                  if ((this->features).shader_interlock.fragmentShaderShadingRateInterlock != 1) {
                    local_3ff = (this->features).shading_rate_nv.shadingRateImage == 1;
                  }
                  this_local._7_1_ = local_3ff;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityShaderSMBuiltinsNV) {
                  this_local._7_1_ = (this->features).sm_builtins_nv.shaderSMBuiltins == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityFragmentShaderPixelInterlockEXT) {
                  this_local._7_1_ =
                       (this->features).shader_interlock.fragmentShaderPixelInterlock == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityDemoteToHelperInvocation) {
                  this_local._7_1_ =
                       (this->features).demote_to_helper.shaderDemoteToHelperInvocation == 1;
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityRayTracingOpacityMicromapEXT) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_3b0,"VK_EXT_opacity_micromap",&local_3b1);
                  sVar1 = std::
                          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::count(&this->enabled_extensions,(key_type *)local_3b0);
                  this_local._7_1_ = sVar1 != 0;
                  std::__cxx11::string::~string(local_3b0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
                  goto LAB_00117e0c;
                }
                if (cap == CapabilityShaderInvocationReorderNV) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_3d8,"VK_NV_ray_tracing_invocation_reorder",&local_3d9);
                  sVar1 = std::
                          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::count(&this->enabled_extensions,(key_type *)local_3d8);
                  this_local._7_1_ = sVar1 != 0;
                  std::__cxx11::string::~string(local_3d8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
                  goto LAB_00117e0c;
                }
                if (cap != CapabilityRayQueryPositionFetchKHR) {
                  if (cap == CapabilityRawAccessChainsNV) {
                    this_local._7_1_ =
                         (this->features).raw_access_chains_nv.shaderRawAccessChains == 1;
                  }
                  else if (cap == CapabilityIntegerFunctions2INTEL) {
                    this_local._7_1_ =
                         (this->features).integer_functions2_intel.shaderIntegerFunctions2 == 1;
                  }
                  else if (cap == CapabilityAtomicFloat32MinMaxEXT) {
                    local_3ee = true;
                    if ((this->features).shader_atomic_float2.shaderBufferFloat32AtomicMinMax != 1)
                    {
                      local_3ee = (this->features).shader_atomic_float2.
                                  shaderSharedFloat32AtomicMinMax == 1;
                    }
                    this_local._7_1_ = local_3ee;
                  }
                  else if (cap == CapabilityAtomicFloat64MinMaxEXT) {
                    local_3ef = true;
                    if ((this->features).shader_atomic_float2.shaderBufferFloat64AtomicMinMax != 1)
                    {
                      local_3ef = (this->features).shader_atomic_float2.
                                  shaderSharedFloat64AtomicMinMax == 1;
                    }
                    this_local._7_1_ = local_3ef;
                  }
                  else if (cap == CapabilityAtomicFloat16MinMaxEXT) {
                    local_3ed = true;
                    if ((this->features).shader_atomic_float2.shaderBufferFloat16AtomicMinMax != 1)
                    {
                      local_3ed = (this->features).shader_atomic_float2.
                                  shaderSharedFloat16AtomicMinMax == 1;
                    }
                    this_local._7_1_ = local_3ed;
                  }
                  else if (cap == CapabilityExpectAssumeKHR) {
                    this_local._7_1_ = (this->features).expect_assume.shaderExpectAssume == 1;
                  }
                  else if (cap - CapabilityDotProductInputAll < 4) {
                    this_local._7_1_ =
                         (this->features).shader_integer_dot_product.shaderIntegerDotProduct == 1;
                  }
                  else if (cap == CapabilityRayCullMaskKHR) {
                    this_local._7_1_ =
                         (this->features).ray_tracing_maintenance1.rayTracingMaintenance1 == 1;
                  }
                  else if (cap == CapabilityCooperativeMatrixKHR) {
                    this_local._7_1_ = (this->features).cooperative_matrix.cooperativeMatrix == 1;
                  }
                  else if (cap == CapabilityReplicatedCompositesEXT) {
                    this_local._7_1_ =
                         (this->features).shader_replicated_composites.shaderReplicatedComposites ==
                         1;
                  }
                  else if (cap == CapabilityGroupNonUniformRotateKHR) {
                    this_local._7_1_ =
                         (this->features).shader_subgroup_rotate.shaderSubgroupRotate == 1;
                  }
                  else if (cap == CapabilityFloatControls2) {
                    this_local._7_1_ =
                         (this->features).shader_float_controls2.shaderFloatControls2 == 1;
                  }
                  else if (cap == CapabilityAtomicFloat32AddEXT) {
                    local_3eb = true;
                    if (((this->features).shader_atomic_float.shaderBufferFloat32AtomicAdd != 1) &&
                       (local_3eb = true,
                       (this->features).shader_atomic_float.shaderSharedFloat32AtomicAdd != 1)) {
                      local_3eb = (this->features).shader_atomic_float.shaderImageFloat32AtomicAdd
                                  == 1;
                    }
                    this_local._7_1_ = local_3eb;
                  }
                  else if (cap == CapabilityAtomicFloat64AddEXT) {
                    local_3ec = true;
                    if ((this->features).shader_atomic_float.shaderBufferFloat64AtomicAdd != 1) {
                      local_3ec = (this->features).shader_atomic_float.shaderSharedFloat64AtomicAdd
                                  == 1;
                    }
                    this_local._7_1_ = local_3ec;
                  }
                  else if (cap == CapabilityAtomicFloat16AddEXT) {
                    local_3ea = true;
                    if ((this->features).shader_atomic_float2.shaderBufferFloat16AtomicAdd != 1) {
                      local_3ea = (this->features).shader_atomic_float2.shaderSharedFloat16AtomicAdd
                                  == 1;
                    }
                    this_local._7_1_ = local_3ea;
                  }
                  else {
                    fprintf(_stderr,
                            "Fossilize ERROR: Unrecognized SPIR-V capability %u, treating as unsupported.\n"
                            ,(ulong)cap);
                    fflush(_stderr);
                    this_local._7_1_ = 0;
                  }
                  goto LAB_00117e0c;
                }
              }
              this_local._7_1_ =
                   (this->features).ray_tracing_position_fetch.rayTracingPositionFetch == 1;
            }
            goto LAB_00117e0c;
          }
        }
      }
    }
  }
  this_local._7_1_ = 1;
LAB_00117e0c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FeatureFilter::Impl::validate_module_capability(spv::Capability cap) const
{
	// From table 75 in Vulkan spec.

	switch (cap)
	{
	case spv::CapabilityMatrix:
	case spv::CapabilityShader:
	case spv::CapabilityInputAttachment:
	case spv::CapabilitySampled1D:
	case spv::CapabilityImage1D:
	case spv::CapabilitySampledBuffer:
	case spv::CapabilityImageBuffer:
	case spv::CapabilityImageQuery:
	case spv::CapabilityDerivativeControl:
	case spv::CapabilityStorageImageExtendedFormats:
		return true;

	case spv::CapabilityDeviceGroup:
		return api_version >= VK_API_VERSION_1_1;

	case spv::CapabilityGeometry:
		return features2.features.geometryShader == VK_TRUE;
	case spv::CapabilityTessellation:
		return features2.features.tessellationShader == VK_TRUE;
	case spv::CapabilityFloat64:
		return features2.features.shaderFloat64 == VK_TRUE;
	case spv::CapabilityInt64:
		return features2.features.shaderInt64 == VK_TRUE;
	case spv::CapabilityInt64Atomics:
		return features.atomic_int64.shaderBufferInt64Atomics == VK_TRUE ||
		       features.atomic_int64.shaderSharedInt64Atomics == VK_TRUE ||
		       features.shader_image_atomic_int64.shaderImageInt64Atomics == VK_TRUE;
	case spv::CapabilityAtomicFloat16AddEXT:
		return features.shader_atomic_float2.shaderBufferFloat16AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat16AtomicAdd == VK_TRUE;
	case spv::CapabilityAtomicFloat32AddEXT:
		return features.shader_atomic_float.shaderBufferFloat32AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float.shaderSharedFloat32AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float.shaderImageFloat32AtomicAdd == VK_TRUE;
	case spv::CapabilityAtomicFloat64AddEXT:
		return features.shader_atomic_float.shaderBufferFloat64AtomicAdd == VK_TRUE ||
		       features.shader_atomic_float.shaderSharedFloat64AtomicAdd == VK_TRUE;
	case spv::CapabilityAtomicFloat16MinMaxEXT:
		return features.shader_atomic_float2.shaderBufferFloat16AtomicMinMax == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat16AtomicMinMax == VK_TRUE;
	case spv::CapabilityAtomicFloat32MinMaxEXT:
		return features.shader_atomic_float2.shaderBufferFloat32AtomicMinMax == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat32AtomicMinMax == VK_TRUE;
	case spv::CapabilityAtomicFloat64MinMaxEXT:
		return features.shader_atomic_float2.shaderBufferFloat64AtomicMinMax == VK_TRUE ||
		       features.shader_atomic_float2.shaderSharedFloat64AtomicMinMax == VK_TRUE;
	case spv::CapabilityInt64ImageEXT:
		return features.shader_image_atomic_int64.shaderImageInt64Atomics == VK_TRUE;
	case spv::CapabilityGroups:
		return enabled_extensions.count(VK_AMD_SHADER_BALLOT_EXTENSION_NAME);
	case spv::CapabilityInt16:
		return features2.features.shaderInt16 == VK_TRUE;
	case spv::CapabilityTessellationPointSize:
	case spv::CapabilityGeometryPointSize:
		return features2.features.shaderTessellationAndGeometryPointSize == VK_TRUE;
	case spv::CapabilityImageGatherExtended:
		return features2.features.shaderImageGatherExtended == VK_TRUE;
	case spv::CapabilityStorageImageMultisample:
		return features2.features.shaderStorageImageMultisample == VK_TRUE;
	case spv::CapabilityUniformBufferArrayDynamicIndexing:
		return features2.features.shaderUniformBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilitySampledImageArrayDynamicIndexing:
		return features2.features.shaderSampledImageArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityStorageBufferArrayDynamicIndexing:
		return features2.features.shaderStorageBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityStorageImageArrayDynamicIndexing:
		return features2.features.shaderStorageImageArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityClipDistance:
		return features2.features.shaderClipDistance == VK_TRUE;
	case spv::CapabilityCullDistance:
		return features2.features.shaderCullDistance == VK_TRUE;
	case spv::CapabilityImageCubeArray:
		return features2.features.imageCubeArray == VK_TRUE;
	case spv::CapabilitySampleRateShading:
		return features2.features.sampleRateShading == VK_TRUE;
	case spv::CapabilitySparseResidency:
		return features2.features.shaderResourceResidency == VK_TRUE;
	case spv::CapabilityMinLod:
		return features2.features.shaderResourceMinLod == VK_TRUE;
	case spv::CapabilitySampledCubeArray:
		return features2.features.imageCubeArray == VK_TRUE;
	case spv::CapabilityImageMSArray:
		return features2.features.shaderStorageImageMultisample == VK_TRUE;
	case spv::CapabilityInterpolationFunction:
		return features2.features.sampleRateShading == VK_TRUE;
	case spv::CapabilityStorageImageReadWithoutFormat:
		return features2.features.shaderStorageImageReadWithoutFormat == VK_TRUE ||
		       api_version >= VK_API_VERSION_1_3 ||
		       enabled_extensions.count(VK_KHR_FORMAT_FEATURE_FLAGS_2_EXTENSION_NAME) != 0;
	case spv::CapabilityStorageImageWriteWithoutFormat:
		return features2.features.shaderStorageImageWriteWithoutFormat == VK_TRUE ||
		       api_version >= VK_API_VERSION_1_3 ||
		       enabled_extensions.count(VK_KHR_FORMAT_FEATURE_FLAGS_2_EXTENSION_NAME) != 0;
	case spv::CapabilityMultiViewport:
		return features2.features.multiViewport == VK_TRUE;
	case spv::CapabilityDrawParameters:
		return features.draw_parameters.shaderDrawParameters == VK_TRUE;
	case spv::CapabilityMultiView:
		return features.multiview.multiview == VK_TRUE;
	case spv::CapabilityVariablePointersStorageBuffer:
		return features.variable_pointers.variablePointersStorageBuffer == VK_TRUE;
	case spv::CapabilityVariablePointers:
		return features.variable_pointers.variablePointers == VK_TRUE;
	case spv::CapabilityShaderClockKHR:
		// There aren't two separate capabilities, so we'd have to analyze all opcodes to deduce this.
		// Just gate this on both feature bits being supported to be safe.
		return features.shader_clock.shaderDeviceClock == VK_TRUE &&
		       features.shader_clock.shaderSubgroupClock == VK_TRUE;
	case spv::CapabilityStencilExportEXT:
		return enabled_extensions.count(VK_EXT_SHADER_STENCIL_EXPORT_EXTENSION_NAME) != 0;
	case spv::CapabilitySubgroupBallotKHR:
		return enabled_extensions.count(VK_EXT_SHADER_SUBGROUP_BALLOT_EXTENSION_NAME) != 0;
	case spv::CapabilitySubgroupVoteKHR:
		return enabled_extensions.count(VK_EXT_SHADER_SUBGROUP_VOTE_EXTENSION_NAME) != 0;
	case spv::CapabilityImageReadWriteLodAMD:
		return enabled_extensions.count(VK_AMD_SHADER_IMAGE_LOAD_STORE_LOD_EXTENSION_NAME) != 0;
	case spv::CapabilityImageGatherBiasLodAMD:
		return enabled_extensions.count(VK_AMD_TEXTURE_GATHER_BIAS_LOD_EXTENSION_NAME) != 0;
	case spv::CapabilityFragmentMaskAMD:
		return enabled_extensions.count(VK_AMD_SHADER_FRAGMENT_MASK_EXTENSION_NAME) != 0;
	case spv::CapabilitySampleMaskOverrideCoverageNV:
		return enabled_extensions.count(VK_NV_SAMPLE_MASK_OVERRIDE_COVERAGE_EXTENSION_NAME) != 0;
	case spv::CapabilityGeometryShaderPassthroughNV:
		return enabled_extensions.count(VK_NV_GEOMETRY_SHADER_PASSTHROUGH_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderViewportIndex:
		return features.vk12.shaderOutputViewportIndex || enabled_extensions.count(VK_EXT_SHADER_VIEWPORT_INDEX_LAYER_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderLayer:
		return features.vk12.shaderOutputLayer || enabled_extensions.count(VK_EXT_SHADER_VIEWPORT_INDEX_LAYER_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderViewportIndexLayerEXT:
		// NV version is a cloned enum.
		return enabled_extensions.count(VK_EXT_SHADER_VIEWPORT_INDEX_LAYER_EXTENSION_NAME) != 0 ||
		       enabled_extensions.count(VK_NV_VIEWPORT_ARRAY2_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderViewportMaskNV:
		return enabled_extensions.count(VK_NV_VIEWPORT_ARRAY2_EXTENSION_NAME) != 0;
	case spv::CapabilityPerViewAttributesNV:
		return enabled_extensions.count(VK_NVX_MULTIVIEW_PER_VIEW_ATTRIBUTES_EXTENSION_NAME) != 0;
	case spv::CapabilityStorageBuffer16BitAccess:
		return features.storage_16bit.storageBuffer16BitAccess == VK_TRUE;
	case spv::CapabilityUniformAndStorageBuffer16BitAccess:
		return features.storage_16bit.uniformAndStorageBuffer16BitAccess == VK_TRUE;
	case spv::CapabilityStoragePushConstant16:
		return features.storage_16bit.storagePushConstant16 == VK_TRUE;
	case spv::CapabilityStorageInputOutput16:
		return features.storage_16bit.storageInputOutput16 == VK_TRUE;
	case spv::CapabilityGroupNonUniform:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_BASIC_BIT) != 0;
	case spv::CapabilityGroupNonUniformVote:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_VOTE_BIT) != 0;
	case spv::CapabilityGroupNonUniformArithmetic:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_ARITHMETIC_BIT) != 0;
	case spv::CapabilityGroupNonUniformBallot:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_BALLOT_BIT) != 0;
	case spv::CapabilityGroupNonUniformShuffle:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_SHUFFLE_BIT) != 0;
	case spv::CapabilityGroupNonUniformShuffleRelative:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_SHUFFLE_RELATIVE_BIT) != 0;
	case spv::CapabilityGroupNonUniformClustered:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_CLUSTERED_BIT) != 0;
	case spv::CapabilityGroupNonUniformQuad:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_QUAD_BIT) != 0;
	case spv::CapabilityGroupNonUniformPartitionedNV:
		return (props.subgroup.supportedOperations & VK_SUBGROUP_FEATURE_PARTITIONED_BIT_NV) != 0;
	case spv::CapabilitySampleMaskPostDepthCoverage:
		return enabled_extensions.count(VK_EXT_POST_DEPTH_COVERAGE_EXTENSION_NAME) != 0;
	case spv::CapabilityShaderNonUniform:
		return enabled_extensions.count(VK_EXT_DESCRIPTOR_INDEXING_EXTENSION_NAME) != 0 || api_version >= VK_API_VERSION_1_2;
	case spv::CapabilityRuntimeDescriptorArray:
		return features.descriptor_indexing.runtimeDescriptorArray == VK_TRUE;
	case spv::CapabilityInputAttachmentArrayDynamicIndexing:
		return features.descriptor_indexing.shaderInputAttachmentArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityUniformTexelBufferArrayDynamicIndexing:
		return features.descriptor_indexing.shaderUniformTexelBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityStorageTexelBufferArrayDynamicIndexing:
		return features.descriptor_indexing.shaderStorageTexelBufferArrayDynamicIndexing == VK_TRUE;
	case spv::CapabilityUniformBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderUniformBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilitySampledImageArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderSampledImageArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityUniformTexelBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderUniformTexelBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityStorageBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderStorageBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityStorageImageArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderStorageImageArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityInputAttachmentArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderInputAttachmentArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityStorageTexelBufferArrayNonUniformIndexing:
		return features.descriptor_indexing.shaderStorageTexelBufferArrayNonUniformIndexing == VK_TRUE;
	case spv::CapabilityFloat16:
		return features.float16_int8.shaderFloat16 == VK_TRUE || enabled_extensions.count(VK_AMD_GPU_SHADER_HALF_FLOAT_EXTENSION_NAME) != 0;
	case spv::CapabilityInt8:
		return features.float16_int8.shaderInt8 == VK_TRUE;
	case spv::CapabilityStorageBuffer8BitAccess:
		return features.storage_8bit.storageBuffer8BitAccess == VK_TRUE;
	case spv::CapabilityUniformAndStorageBuffer8BitAccess:
		return features.storage_8bit.uniformAndStorageBuffer8BitAccess == VK_TRUE;
	case spv::CapabilityStoragePushConstant8:
		return features.storage_8bit.storagePushConstant8 == VK_TRUE;
	case spv::CapabilityVulkanMemoryModel:
		return features.memory_model.vulkanMemoryModel == VK_TRUE;
	case spv::CapabilityVulkanMemoryModelDeviceScope:
		return features.memory_model.vulkanMemoryModelDeviceScope == VK_TRUE;
	case spv::CapabilityDenormPreserve:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderDenormPreserveFloat16 == VK_TRUE ||
		       props.float_control.shaderDenormPreserveFloat32 == VK_TRUE ||
		       props.float_control.shaderDenormPreserveFloat64 == VK_TRUE;
	case spv::CapabilityDenormFlushToZero:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderDenormFlushToZeroFloat16 == VK_TRUE ||
		       props.float_control.shaderDenormFlushToZeroFloat32 == VK_TRUE ||
		       props.float_control.shaderDenormFlushToZeroFloat64 == VK_TRUE;
	case spv::CapabilitySignedZeroInfNanPreserve:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderSignedZeroInfNanPreserveFloat16 == VK_TRUE ||
		       props.float_control.shaderSignedZeroInfNanPreserveFloat32 == VK_TRUE ||
		       props.float_control.shaderSignedZeroInfNanPreserveFloat64 == VK_TRUE;
	case spv::CapabilityRoundingModeRTE:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderRoundingModeRTEFloat16 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTEFloat32 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTEFloat64 == VK_TRUE;
	case spv::CapabilityRoundingModeRTZ:
		// Not sure if we have to inspect every possible type. Assume compiler won't barf if at least one property is set.
		return props.float_control.shaderRoundingModeRTZFloat16 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTZFloat32 == VK_TRUE ||
		       props.float_control.shaderRoundingModeRTZFloat64 == VK_TRUE;
	case spv::CapabilityComputeDerivativeGroupQuadsKHR:
		return features.compute_shader_derivatives.computeDerivativeGroupQuads == VK_TRUE;
	case spv::CapabilityComputeDerivativeGroupLinearKHR:
		return features.compute_shader_derivatives.computeDerivativeGroupLinear == VK_TRUE;
	case spv::CapabilityFragmentBarycentricKHR:
		return features.barycentric.fragmentShaderBarycentric == VK_TRUE;
	case spv::CapabilityImageFootprintNV:
		return features.image_footprint_nv.imageFootprint == VK_TRUE;
	case spv::CapabilityFragmentDensityEXT:
		// Spec mentions ShadingRateImageNV, but that does not appear to exist?
		return features.shading_rate_nv.shadingRateImage == VK_TRUE ||
		       features.fragment_density.fragmentDensityMap == VK_TRUE;
	case spv::CapabilityMeshShadingNV:
		return features.mesh_shader_nv.meshShader == VK_TRUE;
	case spv::CapabilityRayTracingNV:
		return enabled_extensions.count(VK_NV_RAY_TRACING_EXTENSION_NAME) != 0;
	case spv::CapabilityTransformFeedback:
		return features.transform_feedback.transformFeedback == VK_TRUE;
	case spv::CapabilityGeometryStreams:
		return features.transform_feedback.geometryStreams == VK_TRUE;
	case spv::CapabilityPhysicalStorageBufferAddresses:
		// Apparently these are different types?
		return features.buffer_device_address.bufferDeviceAddress == VK_TRUE ||
		       features.buffer_device_address_ext.bufferDeviceAddress == VK_TRUE;
	case spv::CapabilityCooperativeMatrixNV:
		return features.cooperative_matrix_nv.cooperativeMatrix == VK_TRUE;
	case spv::CapabilityIntegerFunctions2INTEL:
		return features.integer_functions2_intel.shaderIntegerFunctions2 == VK_TRUE;
	case spv::CapabilityShaderSMBuiltinsNV:
		return features.sm_builtins_nv.shaderSMBuiltins == VK_TRUE;
	case spv::CapabilityFragmentShaderSampleInterlockEXT:
		return features.shader_interlock.fragmentShaderSampleInterlock == VK_TRUE;
	case spv::CapabilityFragmentShaderPixelInterlockEXT:
		return features.shader_interlock.fragmentShaderPixelInterlock == VK_TRUE;
	case spv::CapabilityFragmentShaderShadingRateInterlockEXT:
		return features.shader_interlock.fragmentShaderShadingRateInterlock == VK_TRUE ||
		       features.shading_rate_nv.shadingRateImage == VK_TRUE;
	case spv::CapabilityDemoteToHelperInvocation:
		return features.demote_to_helper.shaderDemoteToHelperInvocation == VK_TRUE;
	case spv::CapabilityFragmentShadingRateKHR:
		return features.fragment_shading_rate.primitiveFragmentShadingRate == VK_TRUE;
	case spv::CapabilityRayQueryKHR:
		return features.ray_query.rayQuery == VK_TRUE;
	case spv::CapabilityRayTracingKHR:
		return features.ray_tracing_pipeline.rayTracingPipeline == VK_TRUE;
	case spv::CapabilityRayTraversalPrimitiveCullingKHR:
		return features.ray_tracing_pipeline.rayTraversalPrimitiveCulling == VK_TRUE ||
		       features.ray_query.rayQuery == VK_TRUE;
	case spv::CapabilityWorkgroupMemoryExplicitLayoutKHR:
		return features.workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout == VK_TRUE;
	case spv::CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR:
		return features.workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout8BitAccess == VK_TRUE;
	case spv::CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR:
		return features.workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout16BitAccess == VK_TRUE;
	case spv::CapabilityDotProduct:
	case spv::CapabilityDotProductInputAll:
	case spv::CapabilityDotProductInput4x8Bit:
	case spv::CapabilityDotProductInput4x8BitPacked:
		return features.shader_integer_dot_product.shaderIntegerDotProduct == VK_TRUE;
	case spv::CapabilityMeshShadingEXT:
		return features.mesh_shader.meshShader == VK_TRUE;
	case spv::CapabilityFragmentFullyCoveredEXT:
		return enabled_extensions.count(VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME) != 0;
	// AtomicFloat16VectorNV does not seem to exist.
	case spv::CapabilityRayCullMaskKHR:
		return features.ray_tracing_maintenance1.rayTracingMaintenance1 == VK_TRUE;
	case spv::CapabilityRayTracingMotionBlurNV:
		return features.ray_tracing_motion_blur_nv.rayTracingMotionBlur == VK_TRUE;
	case spv::CapabilityRayTracingOpacityMicromapEXT:
		return enabled_extensions.count(VK_EXT_OPACITY_MICROMAP_EXTENSION_NAME) != 0;
	case spv::CapabilityTextureSampleWeightedQCOM:
		return features.image_processing_qcom.textureSampleWeighted == VK_TRUE;
	case spv::CapabilityTextureBoxFilterQCOM:
		return features.image_processing_qcom.textureBoxFilter == VK_TRUE;
	case spv::CapabilityTextureBlockMatchQCOM:
		return features.image_processing_qcom.textureBlockMatch == VK_TRUE;
	case spv::CapabilityTextureBlockMatch2QCOM:
		return features.image_processing2_qcom.textureBlockMatch2 == VK_TRUE;
	case spv::CapabilityCoreBuiltinsARM:
		return features.shader_core_builtins_arm.shaderCoreBuiltins == VK_TRUE;
	case spv::CapabilityShaderInvocationReorderNV:
		return enabled_extensions.count(VK_NV_RAY_TRACING_INVOCATION_REORDER_EXTENSION_NAME) != 0;
	// Ignore CapabilityClusterCullingShadingHUAWEI. It does not exist in SPIR-V headers.
	case spv::CapabilityRayTracingPositionFetchKHR:
	case spv::CapabilityRayQueryPositionFetchKHR:
		return features.ray_tracing_position_fetch.rayTracingPositionFetch == VK_TRUE;
	case spv::CapabilityTileImageColorReadAccessEXT:
		return features.shader_tile_image.shaderTileImageColorReadAccess == VK_TRUE;
	case spv::CapabilityTileImageDepthReadAccessEXT:
		return features.shader_tile_image.shaderTileImageDepthReadAccess == VK_TRUE;
	case spv::CapabilityTileImageStencilReadAccessEXT:
		return features.shader_tile_image.shaderTileImageStencilReadAccess == VK_TRUE;
	case spv::CapabilityCooperativeMatrixKHR:
		return features.cooperative_matrix.cooperativeMatrix == VK_TRUE;
	// Ignore ShaderEnqueueAMDX, it's a beta extension.
	case spv::CapabilityGroupNonUniformRotateKHR:
		return features.shader_subgroup_rotate.shaderSubgroupRotate == VK_TRUE;
	case spv::CapabilityExpectAssumeKHR:
		return features.expect_assume.shaderExpectAssume == VK_TRUE;
	case spv::CapabilityFloatControls2:
		return features.shader_float_controls2.shaderFloatControls2 == VK_TRUE;
	case spv::CapabilityQuadControlKHR:
		return features.shader_quad_control.shaderQuadControl == VK_TRUE;
	case spv::CapabilityRawAccessChainsNV:
		return features.raw_access_chains_nv.shaderRawAccessChains == VK_TRUE;
	case spv::CapabilityReplicatedCompositesEXT:
		return features.shader_replicated_composites.shaderReplicatedComposites == VK_TRUE;

	default:
		LOGE("Unrecognized SPIR-V capability %u, treating as unsupported.\n", unsigned(cap));
		return false;
	}
}